

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

void __thiscall booster::locale::calendar::calendar(calendar *this,locale *l)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  
  std::locale::locale(&this->locale_,l);
  time_zone::global_abi_cxx11_();
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(l);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1);
  (this->impl_).ptr_ = paVar2;
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,&this->tz_);
  return;
}

Assistant:

calendar::calendar(std::locale const &l) :
    locale_(l),
    tz_(time_zone::global()),
    impl_(std::use_facet<calendar_facet>(l).create_calendar())
{
    impl_->set_timezone(tz_);
}